

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

void Wlc_NtkFindOneNode(Wlc_Ntk_t *p,Wlc_Obj_t *pWlcObj,Gia_Man_t *pGia,Vec_Mem_t *vTtMem)

{
  long lVar1;
  word *pEntry;
  uint uVar2;
  word wVar3;
  int iVar4;
  byte bVar5;
  int w;
  uint uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint *puVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  uint iObj;
  int iVar14;
  
  uVar6 = (int)((long)pWlcObj - (long)p->pObjs >> 3) * -0x55555555;
  if ((-1 < (int)uVar6) && ((int)uVar6 < (p->vCopies).nSize)) {
    uVar2 = vTtMem->nEntrySize;
    iVar12 = pWlcObj->Beg - pWlcObj->End;
    iVar4 = -iVar12;
    if (0 < iVar12) {
      iVar4 = iVar12;
    }
    iVar12 = (p->vCopies).pArray[uVar6 & 0x7fffffff];
    uVar13 = 0;
    while ((-1 < iVar12 && (lVar1 = (long)iVar12 + uVar13, lVar1 < (p->vBits).nSize))) {
      uVar6 = (p->vBits).pArray[lVar1];
      if ((int)uVar6 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar7 = (uVar6 >> 1) * pGia->nSimWords;
      if (((int)uVar7 < 0) || (pGia->vSims->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      pEntry = pGia->vSims->pArray + uVar7;
      wVar3 = *pEntry;
      bVar5 = (byte)wVar3;
      if ((0 < (int)uVar2 & bVar5) == 1) {
        uVar9 = 0;
        do {
          pEntry[uVar9] = ~pEntry[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      puVar10 = (uint *)Vec_MemHashLookup(vTtMem,pEntry);
      uVar7 = *puVar10;
      if (0 < (int)uVar7) {
        iObj = (int)((ulong)((long)pWlcObj - (long)p->pObjs) >> 3) * -0x55555555;
        iVar8 = pWlcObj->End - pWlcObj->Beg;
        iVar14 = -iVar8;
        if (0 < iVar8) {
          iVar14 = iVar8;
        }
        pcVar11 = Wlc_ObjName(p,iObj);
        printf("Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n",(ulong)iObj,
               (ulong)(iVar14 + 1),uVar13 & 0xffffffff,(ulong)uVar7,
               (ulong)((uVar6 ^ (uint)wVar3) & 1),pcVar11);
      }
      if ((0 < (int)uVar2 & bVar5) == 1) {
        uVar9 = 0;
        do {
          pEntry[uVar9] = ~pEntry[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      uVar13 = uVar13 + 1;
      if (uVar13 == iVar4 + 1) {
        return;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Wlc_NtkFindOneNode( Wlc_Ntk_t * p, Wlc_Obj_t * pWlcObj, Gia_Man_t * pGia, Vec_Mem_t * vTtMem )
{
    int k, Entry;
    int nWords = Vec_MemEntrySize(vTtMem);
    int nBits = Wlc_ObjRange(pWlcObj);
    int iFirst = Vec_IntEntry( &p->vCopies, Wlc_ObjId(p, pWlcObj) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLit = Vec_IntEntry( &p->vBits, iFirst + k );
        word * pInfoObj = Wlc_ObjSim( pGia, Abc_Lit2Var(iLit) );
        int fCompl = pInfoObj[0] & 1;
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry > 0 )
            printf( "Obj %4d.  Range = %2d.  Bit %2d.  Entry %d(%d).  %s\n", Wlc_ObjId(p, pWlcObj), Wlc_ObjRange(pWlcObj), k, Entry, fCompl ^ Abc_LitIsCompl(iLit), Wlc_ObjName(p, Wlc_ObjId(p, pWlcObj)) );
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        //printf( "%2d ", Entry );
        //Extra_PrintHex( stdout, (unsigned*)pInfoObj, 8 );
        //printf( "\n" );
    }
    //printf( "\n" );
}